

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

int mod2dense_flip(mod2dense *m,int row,int col)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar9;
  mod2entry *extraout_RAX;
  mod2entry *pmVar10;
  FILE *pFVar11;
  FILE *pFVar12;
  size_t sVar13;
  ulong uVar14;
  FILE *pFVar15;
  uint uVar16;
  int *extraout_RDX;
  FILE *r;
  long extraout_RDX_00;
  ulong uVar17;
  long extraout_RDX_01;
  FILE *pFVar18;
  uint uVar19;
  int row_00;
  undefined4 in_register_00000034;
  FILE *r_00;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  FILE *unaff_R14;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iStack_1bc;
  FILE *pFStack_1b8;
  FILE *pFStack_1b0;
  code *pcStack_1a8;
  FILE *pFStack_198;
  FILE *pFStack_190;
  ulong uStack_188;
  uint uStack_f0;
  int iStack_ec;
  
  pFVar18 = (FILE *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    uVar2 = m->col[(uint)col][(uint)row >> 5];
    bVar29 = (uVar2 >> (row & 0x1fU) & 1) == 0;
    uVar3 = uVar2 & ~(1 << (row & 0x1fU));
    if (bVar29) {
      uVar3 = uVar2 | 1 << (row & 0x1fU);
    }
    m->col[(uint)col][(uint)row >> 5] = uVar3;
    return (uint)bVar29;
  }
  mod2dense_flip_cold_1();
  if ((((FILE *)m)->_flags == *(int *)&pFVar18->field_0x4) &&
     (unaff_R14 = (FILE *)m, *(int *)&((FILE *)m)->field_0x4 == pFVar18->_flags)) {
    if (pFVar18 != (FILE *)m) {
      pFVar15 = pFVar18;
      mod2dense_clear((mod2dense *)pFVar18);
      iVar24 = *(int *)&((FILE *)m)->field_0x4;
      pmVar10 = extraout_RAX;
      if (0 < iVar24) {
        pmVar10 = (mod2entry *)((FILE *)m)->_IO_read_end;
        iVar9 = *(int *)&pFVar18->field_0x4;
        uVar14 = 0;
        do {
          if (0 < iVar9) {
            puVar20 = *(uint **)(&pmVar10->row + uVar14 * 2);
            lVar22 = 0;
            iVar24 = 0;
            do {
              if (iVar24 == 0) {
                pFVar15 = (FILE *)(ulong)*puVar20;
                puVar20 = puVar20 + 1;
                iVar24 = 0x20;
              }
              if (((ulong)pFVar15 & 1) != 0) {
                puVar1 = (uint *)(*(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + lVar22 * 2)
                                 + (uVar14 >> 5 & 0x7ffffff) * 4);
                *puVar1 = *puVar1 | 1 << ((byte)uVar14 & 0x1f);
                iVar9 = *(int *)&pFVar18->field_0x4;
              }
              pFVar15 = (FILE *)((ulong)pFVar15 >> 1 & 0x7fffffff);
              iVar24 = iVar24 + -1;
              lVar22 = lVar22 + 1;
            } while (lVar22 < iVar9);
            iVar24 = *(int *)&((FILE *)m)->field_0x4;
          }
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)iVar24);
      }
      return (int)pmVar10;
    }
  }
  else {
    mod2dense_transpose_cold_1();
  }
  mod2dense_transpose_cold_2();
  if (((((FILE *)m)->_flags == *extraout_RDX) &&
      (iVar24 = *(int *)&((FILE *)m)->field_0x4, iVar24 == extraout_RDX[1])) &&
     ((pFVar18->_flags == ((FILE *)m)->_flags && (*(int *)&pFVar18->field_0x4 == iVar24)))) {
    if (0 < iVar24) {
      uVar14 = (ulong)(uint)extraout_RDX[2];
      lVar22 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar27 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + lVar22 * 2);
          lVar5 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + lVar22 * 2);
          lVar6 = *(long *)(*(long *)(extraout_RDX + 4) + lVar22 * 8);
          lVar25 = 0;
          do {
            *(uint *)(lVar6 + lVar25 * 4) =
                 *(uint *)(lVar5 + lVar25 * 4) ^ *(uint *)(lVar27 + lVar25 * 4);
            lVar25 = lVar25 + 1;
            uVar14 = (ulong)extraout_RDX[2];
          } while (lVar25 < (long)uVar14);
          iVar24 = extraout_RDX[1];
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar24);
    }
    return extraout_EAX;
  }
  mod2dense_add_cold_1();
  if (((*(int *)&((FILE *)m)->field_0x4 == pFVar18->_flags) && (((FILE *)m)->_flags == r->_flags))
     && (unaff_R14 = pFVar18, *(int *)&pFVar18->field_0x4 == *(int *)&r->field_0x4)) {
    if ((r != (FILE *)m) && (r != pFVar18)) {
      mod2dense_clear((mod2dense *)r);
      iVar24 = *(int *)&r->field_0x4;
      iVar9 = extraout_EAX_00;
      if (0 < iVar24) {
        uVar14 = (ulong)(uint)pFVar18->_flags;
        lVar22 = 0;
        do {
          if (0 < (int)uVar14) {
            lVar27 = 0;
            do {
              iVar24 = mod2dense_get((mod2dense *)pFVar18,(int)lVar27,(int)lVar22);
              if ((iVar24 != 0) && (0 < *(int *)&r->_IO_read_ptr)) {
                lVar5 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + lVar27 * 2);
                lVar6 = *(long *)(&((mod2entry *)r->_IO_read_end)->row + lVar22 * 2);
                lVar25 = 0;
                do {
                  puVar20 = (uint *)(lVar6 + lVar25 * 4);
                  *puVar20 = *puVar20 ^ *(uint *)(lVar5 + lVar25 * 4);
                  lVar25 = lVar25 + 1;
                } while (lVar25 < *(int *)&r->_IO_read_ptr);
              }
              lVar27 = lVar27 + 1;
              uVar14 = (ulong)pFVar18->_flags;
            } while (lVar27 < (long)uVar14);
            iVar24 = *(int *)&r->field_0x4;
          }
          iVar9 = (int)uVar14;
          lVar22 = lVar22 + 1;
        } while (lVar22 < iVar24);
      }
      return iVar9;
    }
  }
  else {
    mod2dense_multiply_cold_1();
  }
  mod2dense_multiply_cold_2();
  uVar2 = ((FILE *)m)->_flags;
  uVar14 = (ulong)uVar2;
  if (uVar2 == pFVar18->_flags) {
    uVar3 = *(uint *)&((FILE *)m)->field_0x4;
    if (uVar3 == *(uint *)&pFVar18->field_0x4) {
      if (0 < (int)uVar3) {
        uVar14 = (ulong)(*(int *)&((FILE *)m)->_IO_read_ptr - 1);
        uVar23 = 0;
        do {
          lVar22 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar23 * 2);
          lVar27 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + uVar23 * 2);
          uVar28 = 0;
          uVar21 = uVar28;
          if (1 < *(int *)&((FILE *)m)->_IO_read_ptr) {
            do {
              if (*(int *)(lVar22 + uVar28 * 4) != *(int *)(lVar27 + uVar28 * 4)) {
                return 0;
              }
              uVar28 = uVar28 + 1;
              uVar21 = uVar14;
            } while (uVar14 != uVar28);
          }
          if (((*(uint *)(lVar27 + uVar21 * 4) ^ *(uint *)(lVar22 + uVar21 * 4)) &
              ~(-1 << ((byte)uVar2 & 0x1f))) != 0) {
            return 0;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar3);
      }
      return 1;
    }
  }
  mod2dense_equal_cold_1();
  uVar2 = ((FILE *)m)->_flags;
  uVar23 = (ulong)uVar2;
  pFVar15 = (FILE *)m;
  if (uVar2 == *(uint *)&((FILE *)m)->field_0x4) {
    if (pFVar18 != (FILE *)m) {
      if ((pFVar18->_flags == uVar2) && (*(uint *)&pFVar18->field_0x4 == uVar2)) {
        uVar3 = *(uint *)&((FILE *)m)->_IO_read_ptr;
        mod2dense_clear((mod2dense *)pFVar18);
        if (0 < (int)uVar2) {
          uVar19 = 0;
          do {
            mod2dense_set((mod2dense *)pFVar18,uVar19,uVar19,1);
            uVar19 = uVar19 + 1;
          } while (uVar2 != uVar19);
          if (0 < (int)uVar2) {
            uVar14 = 0;
            while( true ) {
              uVar28 = uVar14 >> 5 & 0x7ffffff;
              pmVar10 = (mod2entry *)((FILE *)m)->_IO_read_end;
              uVar19 = 1 << ((byte)uVar14 & 0x1f);
              uVar21 = uVar14;
              while ((*(uint *)(*(long *)(&pmVar10->row + uVar21 * 2) + uVar28 * 4) & uVar19) == 0)
              {
                uVar21 = uVar21 + 1;
                if (uVar23 == uVar21) {
                  return 0;
                }
              }
              if (uVar2 == (uint)uVar21) break;
              uVar21 = uVar21 & 0xffffffff;
              if (uVar14 != uVar21) {
                uVar7 = *(undefined8 *)(&pmVar10->row + uVar14 * 2);
                *(undefined8 *)(&pmVar10->row + uVar14 * 2) =
                     *(undefined8 *)(&pmVar10->row + uVar21 * 2);
                *(undefined8 *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar21 * 2) = uVar7
                ;
                pmVar10 = (mod2entry *)pFVar18->_IO_read_end;
                uVar7 = *(undefined8 *)(&pmVar10->row + uVar14 * 2);
                *(undefined8 *)(&pmVar10->row + uVar14 * 2) =
                     *(undefined8 *)(&pmVar10->row + uVar21 * 2);
                *(undefined8 *)(&((mod2entry *)pFVar18->_IO_read_end)->row + uVar21 * 2) = uVar7;
              }
              uVar21 = 0;
              do {
                if (uVar21 != uVar14) {
                  lVar22 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar21 * 2);
                  if ((*(uint *)(lVar22 + uVar28 * 4) & uVar19) != 0) {
                    if ((int)uVar28 < (int)uVar3) {
                      lVar27 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar14 * 2
                                        );
                      uVar26 = uVar14 >> 5;
                      do {
                        puVar20 = (uint *)(lVar22 + uVar26 * 4);
                        *puVar20 = *puVar20 ^ *(uint *)(lVar27 + uVar26 * 4);
                        uVar26 = uVar26 + 1;
                      } while ((uVar3 + (int)(uVar14 >> 5)) - (int)uVar28 != uVar26);
                    }
                    if (0 < (int)uVar3) {
                      lVar22 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + uVar21 * 2);
                      lVar27 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + uVar14 * 2);
                      uVar26 = 0;
                      do {
                        puVar20 = (uint *)(lVar22 + uVar26 * 4);
                        *puVar20 = *puVar20 ^ *(uint *)(lVar27 + uVar26 * 4);
                        uVar26 = uVar26 + 1;
                      } while (uVar3 != uVar26);
                    }
                  }
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar23);
              uVar14 = uVar14 + 1;
              if (uVar14 == uVar23) {
                return 1;
              }
            }
            return 0;
          }
        }
        return 1;
      }
      mod2dense_invert_cold_2();
      unaff_R14 = (FILE *)m;
      goto LAB_00123447;
    }
  }
  else {
LAB_00123447:
    m = (mod2dense *)unaff_R14;
    mod2dense_invert_cold_1();
  }
  mod2dense_invert_cold_3();
  r_00 = pFVar18;
  if (pFVar18 != pFVar15) {
    uVar2 = pFVar15->_flags;
    if (pFVar18->_flags == uVar2) {
      uVar3 = *(uint *)&pFVar15->field_0x4;
      uVar21 = (ulong)uVar3;
      if (*(uint *)&pFVar18->field_0x4 == uVar3) {
        uVar19 = *(uint *)&pFVar15->_IO_read_ptr;
        uVar23 = (ulong)uVar19;
        mod2dense_clear((mod2dense *)pFVar18);
        auVar8 = _DAT_00127fa0;
        if (0 < (int)uVar2) {
          lVar22 = (ulong)uVar2 - 1;
          auVar30._8_4_ = (int)lVar22;
          auVar30._0_8_ = lVar22;
          auVar30._12_4_ = (int)((ulong)lVar22 >> 0x20);
          uVar28 = 0;
          auVar30 = auVar30 ^ _DAT_00127fa0;
          auVar33 = _DAT_00127f90;
          do {
            auVar32 = auVar33 ^ auVar8;
            if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                        auVar30._4_4_ < auVar32._4_4_) & 1)) {
              *(int *)(extraout_RDX_00 + uVar28 * 4) = (int)uVar28;
            }
            if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
                auVar32._12_4_ <= auVar30._12_4_) {
              *(int *)(extraout_RDX_00 + 4 + uVar28 * 4) = (int)uVar28 + 1;
            }
            uVar28 = uVar28 + 2;
            lVar22 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 2;
            auVar33._8_8_ = lVar22 + 2;
          } while ((uVar2 + 1 & 0xfffffffe) != uVar28);
        }
        auVar8 = _DAT_00127fa0;
        lVar22 = 0;
        uVar28 = 0;
        if (0 < (int)uVar3) {
          lVar27 = uVar21 - 1;
          auVar31._8_4_ = (int)lVar27;
          auVar31._0_8_ = lVar27;
          auVar31._12_4_ = (int)((ulong)lVar27 >> 0x20);
          uVar28 = 0;
          auVar31 = auVar31 ^ _DAT_00127fa0;
          auVar32 = _DAT_00127f90;
          do {
            auVar33 = auVar32 ^ auVar8;
            if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                        auVar31._4_4_ < auVar33._4_4_) & 1)) {
              *(int *)(uVar14 + uVar28 * 4) = (int)uVar28;
            }
            if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
                auVar33._12_4_ <= auVar31._12_4_) {
              *(int *)(uVar14 + 4 + uVar28 * 4) = (int)uVar28 + 1;
            }
            uVar28 = uVar28 + 2;
            lVar27 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 2;
            auVar32._8_8_ = lVar27 + 2;
          } while ((uVar3 + 1 & 0xfffffffe) != uVar28);
          uVar28 = (ulong)uVar3;
        }
        uVar26 = 0;
        do {
          uVar16 = uVar2 - (int)lVar22;
          uVar17 = (ulong)uVar16;
          if ((long)uVar26 < (long)(int)uVar16) {
            lVar22 = (long)(int)lVar22;
            do {
              uVar16 = *(uint *)(extraout_RDX_00 + uVar26 * 4);
              iStack_ec = (int)uVar16 >> 5;
              uStack_f0 = uVar16 & 0x1f;
              uVar28 = uVar26 & 0xffffffff;
              if ((long)uVar26 < (long)(int)uVar3) {
                uVar28 = uVar26;
                do {
                  if ((*(uint *)(*(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                          (long)*(int *)(uVar14 + uVar28 * 4) * 2) +
                                (long)iStack_ec * 4) & 1 << (sbyte)uStack_f0) != 0)
                  goto LAB_00123677;
                  uVar28 = uVar28 + 1;
                } while (uVar21 != uVar28);
                uVar28 = (ulong)uVar3;
              }
              lVar22 = lVar22 + 1;
              uVar17 = (int)uVar2 - lVar22;
              *(undefined4 *)(extraout_RDX_00 + uVar26 * 4) =
                   *(undefined4 *)(extraout_RDX_00 + uVar17 * 4);
              *(uint *)(extraout_RDX_00 + uVar17 * 4) = uVar16;
            } while ((long)uVar26 < (long)uVar17);
          }
LAB_00123677:
          if (uVar26 == (uVar17 & 0xffffffff)) {
            if ((int)uVar17 < (int)uVar2) {
              pmVar10 = (mod2entry *)pFVar18->_IO_read_end;
              lVar27 = (long)(int)uVar17;
              do {
                if (0 < (int)uVar19) {
                  memset(*(void **)(&pmVar10->row + (long)*(int *)(uVar14 + lVar27 * 4) * 2),0,
                         uVar23 * 4);
                }
                lVar27 = lVar27 + 1;
              } while ((int)uVar2 != lVar27);
            }
            return (int)lVar22;
          }
          uVar16 = *(uint *)(uVar14 + (long)(int)uVar28 * 4);
          *(undefined4 *)(uVar14 + (long)(int)uVar28 * 4) = *(undefined4 *)(uVar14 + uVar26 * 4);
          *(uint *)(uVar14 + uVar26 * 4) = uVar16;
          mod2dense_set((mod2dense *)pFVar18,*(int *)(extraout_RDX_00 + uVar26 * 4),uVar16,1);
          if ((int)uVar3 < 1) {
            uVar28 = 0;
          }
          else {
            uVar28 = 0;
            do {
              if (uVar28 != uVar16) {
                lVar27 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row + uVar28 * 2);
                if (((*(uint *)(lVar27 + (long)iStack_ec * 4) & 1 << ((byte)uStack_f0 & 0x1f)) != 0)
                   && (0 < (int)uVar19)) {
                  lVar5 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                   (long)(int)uVar16 * 2);
                  uVar17 = 0;
                  do {
                    puVar20 = (uint *)(lVar27 + uVar17 * 4);
                    *puVar20 = *puVar20 ^ *(uint *)(lVar5 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar23 != uVar17);
                  if (0 < (int)uVar19) {
                    lVar27 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row + uVar28 * 2);
                    lVar5 = *(long *)(&((mod2entry *)pFVar18->_IO_read_end)->row +
                                     (long)(int)uVar16 * 2);
                    uVar17 = 0;
                    do {
                      puVar20 = (uint *)(lVar27 + uVar17 * 4);
                      *puVar20 = *puVar20 ^ *(uint *)(lVar5 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar23 != uVar17);
                  }
                }
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar21);
            uVar28 = (ulong)uVar3;
          }
          uVar26 = uVar26 + 1;
        } while( true );
      }
    }
    mod2dense_invert_selected_cold_1();
    m = (mod2dense *)pFVar18;
  }
  mod2dense_invert_selected_cold_2();
  uVar2 = pFVar15->_flags;
  pFVar18 = (FILE *)(ulong)uVar2;
  if (uVar2 == *(uint *)&pFVar15->field_0x4) {
    if (r_00 == pFVar15) goto LAB_001239c7;
    if ((r_00->_flags == uVar2) && (*(uint *)&r_00->field_0x4 == uVar2)) {
      uVar3 = *(uint *)&pFVar15->_IO_read_ptr;
      mod2dense_clear((mod2dense *)r_00);
      if (0 < (int)uVar2) {
        uVar19 = 0;
        do {
          mod2dense_set((mod2dense *)r_00,uVar19,uVar19,1);
          uVar19 = uVar19 + 1;
        } while (uVar2 != uVar19);
        if (0 < (int)uVar2) {
          pFVar11 = (FILE *)0x0;
          do {
            *(undefined4 *)(extraout_RDX_01 + (long)pFVar11 * 4) = 0xffffffff;
            *(int *)(uVar14 + (long)pFVar11 * 4) = (int)pFVar11;
            pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
          } while (pFVar18 != pFVar11);
          if (0 < (int)uVar2) {
            pFVar11 = (FILE *)0x0;
            do {
              iVar24 = (int)pFVar11;
              uVar23 = (ulong)pFVar11 >> 5 & 0x7ffffff;
              pmVar10 = (mod2entry *)pFVar15->_IO_read_end;
              uVar19 = 1 << ((byte)pFVar11 & 0x1f);
              pFVar12 = pFVar11;
              do {
                if ((*(uint *)(*(long *)(&pmVar10->row + (long)pFVar12 * 2) + uVar23 * 4) & uVar19)
                    != 0) {
                  if (uVar2 != (uint)pFVar12) {
                    pFVar12 = (FILE *)((ulong)pFVar12 & 0xffffffff);
                    if (pFVar11 != pFVar12) {
                      uVar7 = *(undefined8 *)(&pmVar10->row + (long)pFVar11 * 2);
                      *(undefined8 *)(&pmVar10->row + (long)pFVar11 * 2) =
                           *(undefined8 *)(&pmVar10->row + (long)pFVar12 * 2);
                      *(undefined8 *)
                       (&((mod2entry *)pFVar15->_IO_read_end)->row + (long)pFVar12 * 2) = uVar7;
                      pmVar10 = (mod2entry *)r_00->_IO_read_end;
                      uVar7 = *(undefined8 *)(&pmVar10->row + (long)pFVar11 * 2);
                      *(undefined8 *)(&pmVar10->row + (long)pFVar11 * 2) =
                           *(undefined8 *)(&pmVar10->row + (long)pFVar12 * 2);
                      *(undefined8 *)(&((mod2entry *)r_00->_IO_read_end)->row + (long)pFVar12 * 2) =
                           uVar7;
                      uVar4 = *(undefined4 *)(uVar14 + (long)pFVar11 * 4);
                      *(undefined4 *)(uVar14 + (long)pFVar11 * 4) =
                           *(undefined4 *)(uVar14 + (long)pFVar12 * 4);
                      *(undefined4 *)(uVar14 + (long)pFVar12 * 4) = uVar4;
                    }
                    goto LAB_001238c8;
                  }
                  break;
                }
                pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
              } while (pFVar18 != pFVar12);
              mod2dense_set((mod2dense *)pFVar15,iVar24,iVar24,1);
              *(int *)(extraout_RDX_01 + (long)pFVar11 * 4) = iVar24;
LAB_001238c8:
              pFVar12 = (FILE *)0x0;
              do {
                if (pFVar12 != pFVar11) {
                  lVar22 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row + (long)pFVar12 * 2)
                  ;
                  if ((*(uint *)(lVar22 + uVar23 * 4) & uVar19) != 0) {
                    if ((int)uVar23 < (int)uVar3) {
                      lVar27 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                        (long)pFVar11 * 2);
                      uVar21 = (ulong)pFVar11 >> 5;
                      do {
                        puVar20 = (uint *)(lVar22 + uVar21 * 4);
                        *puVar20 = *puVar20 ^ *(uint *)(lVar27 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while ((uVar3 + (int)((ulong)pFVar11 >> 5)) - (int)uVar23 != uVar21);
                    }
                    if (0 < (int)uVar3) {
                      lVar22 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row + (long)pFVar12 * 2
                                        );
                      lVar27 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row + (long)pFVar11 * 2
                                        );
                      uVar21 = 0;
                      do {
                        puVar20 = (uint *)(lVar22 + uVar21 * 4);
                        *puVar20 = *puVar20 ^ *(uint *)(lVar27 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while (uVar3 != uVar21);
                    }
                  }
                }
                pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
              } while (pFVar12 != pFVar18);
              pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
            } while (pFVar11 != pFVar18);
            if (0 < (int)uVar2) {
              pFVar15 = (FILE *)0x0;
              iVar24 = 0;
              do {
                iVar9 = *(int *)(extraout_RDX_01 + (long)pFVar15 * 4);
                if (iVar9 != -1) {
                  *(int *)(extraout_RDX_01 + (long)iVar24 * 4) = iVar9;
                  *(undefined4 *)(uVar14 + (long)iVar24 * 4) =
                       *(undefined4 *)(uVar14 + (long)pFVar15 * 4);
                  iVar24 = iVar24 + 1;
                }
                pFVar15 = (FILE *)((long)&pFVar15->_flags + 1);
              } while (pFVar18 != pFVar15);
              return iVar24;
            }
          }
        }
      }
      return 0;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_001239c7:
  mod2dense_forcibly_invert_cold_3();
  if ((pFVar15->_flags <= r_00->_flags) &&
     (pFVar18 = r_00, m = (mod2dense *)pFVar15,
     *(int *)&pFVar15->field_0x4 <= *(int *)&r_00->field_0x4)) {
    mod2dense_clear((mod2dense *)r_00);
    iVar24 = pFVar15->_flags;
    if (0 < iVar24) {
      lVar22 = 0;
      do {
        pmVar10 = ((mod2entry *)pFVar15->_IO_read_ptr)[lVar22].right;
        if (-1 < pmVar10->row) {
          do {
            mod2dense_set((mod2dense *)r_00,(int)lVar22,pmVar10->col,1);
            pmVar10 = pmVar10->right;
          } while (-1 < pmVar10->row);
          iVar24 = pFVar15->_flags;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar24);
    }
    return iVar24;
  }
  mod2sparse_to_dense_cold_1();
  pFVar11 = (FILE *)m;
  pFStack_198 = pFVar18;
  pFStack_190 = (FILE *)m;
  uStack_188 = uVar23;
  if ((pFVar15->_flags <= r_00->_flags) &&
     (pFVar18 = r_00, pFVar11 = pFVar15, *(int *)&pFVar15->field_0x4 <= *(int *)&r_00->field_0x4)) {
    pcStack_1a8 = (code *)0x123a71;
    mod2sparse_clear((mod2sparse *)r_00);
    iVar24 = pFVar15->_flags;
    iVar9 = extraout_EAX_01;
    if (0 < iVar24) {
      iVar9 = *(int *)&pFVar15->field_0x4;
      row_00 = 0;
      do {
        if (0 < iVar9) {
          iVar24 = 0;
          do {
            pcStack_1a8 = (code *)0x123a92;
            iVar9 = mod2dense_get((mod2dense *)pFVar15,row_00,iVar24);
            if (iVar9 != 0) {
              pcStack_1a8 = (code *)0x123aa3;
              mod2sparse_insert((mod2sparse *)r_00,row_00,iVar24);
            }
            iVar24 = iVar24 + 1;
            iVar9 = *(int *)&pFVar15->field_0x4;
          } while (iVar24 < iVar9);
          iVar24 = pFVar15->_flags;
        }
        row_00 = row_00 + 1;
      } while (row_00 < iVar24);
    }
    return iVar9;
  }
  pcStack_1a8 = intio_read;
  mod2dense_to_sparse_cold_1();
  lVar22 = 0;
  pFStack_1b8 = pFVar18;
  pFStack_1b0 = pFVar11;
  pcStack_1a8 = (code *)uVar23;
  do {
    sVar13 = fread((void *)((long)&iStack_1bc + lVar22),1,1,pFVar15);
    if (sVar13 != 1) {
      return 0;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  return iStack_1bc;
}

Assistant:

int mod2dense_flip  
( mod2dense *m, 	/* Matrix to flip element in */
  int row,		/* Row of element (starting with zero) */
  int col		/* Column of element (starting with zero) */
)
{
  mod2word *w;
  int b;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_flip: row or column index out of bounds\n");
    exit(1);
  }

  b = 1 ^ mod2_getbit (m->col[col][row>>mod2_wordsize_shift], 
                       row&mod2_wordsize_mask);

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = b ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
         : mod2_setbit0(*w,row&mod2_wordsize_mask);

  return b;
}